

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExtraCodeLiteGenerator.cxx
# Opt level: O2

string * __thiscall
cmExtraCodeLiteGenerator::CollectSourceFiles
          (string *__return_storage_ptr__,cmExtraCodeLiteGenerator *this,cmMakefile *makefile,
          cmGeneratorTarget *gt,
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmSourceFile_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmSourceFile_*>_>_>
          *cFiles,set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *otherFiles)

{
  cmake *pcVar1;
  cmSourceFile *this_00;
  bool bVar2;
  __type _Var3;
  TargetType TVar4;
  char *pcVar5;
  string *psVar6;
  mapped_type *ppcVar7;
  pointer ppcVar8;
  pointer __rhs;
  vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> sources;
  string lang;
  allocator local_a2;
  allocator local_a1;
  string *local_a0;
  _Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> local_98;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmSourceFile_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmSourceFile_*>_>_>
  *local_80;
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  *local_78;
  string local_70;
  string local_50;
  
  pcVar1 = ((this->super_cmExternalMakefileProjectGenerator).GlobalGenerator)->CMakeInstance;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  local_a0 = __return_storage_ptr__;
  local_80 = cFiles;
  local_78 = (_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              *)otherFiles;
  TVar4 = cmGeneratorTarget::GetType(gt);
  if (TVar4 < OBJECT_LIBRARY) {
    std::__cxx11::string::assign((char *)local_a0);
  }
  TVar4 = cmGeneratorTarget::GetType(gt);
  if (TVar4 < OBJECT_LIBRARY) {
    local_98._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_98._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_98._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::__cxx11::string::string((string *)&local_50,"CMAKE_BUILD_TYPE",&local_a1);
    pcVar5 = cmMakefile::GetSafeDefinition(makefile,&local_50);
    std::__cxx11::string::string((string *)&local_70,pcVar5,&local_a2);
    cmGeneratorTarget::GetSourceFiles
              (gt,(vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> *)&local_98,&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_50);
    for (ppcVar8 = local_98._M_impl.super__Vector_impl_data._M_start;
        ppcVar8 != local_98._M_impl.super__Vector_impl_data._M_finish; ppcVar8 = ppcVar8 + 1) {
      cmSourceFile::GetLanguage_abi_cxx11_(&local_70,*ppcVar8);
      bVar2 = std::operator==(&local_70,"C");
      if (bVar2) {
LAB_003de345:
        psVar6 = cmSourceFile::GetExtension_abi_cxx11_(*ppcVar8);
        __rhs = (pcVar1->SourceFileExtensions).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
        do {
          if (__rhs == (pcVar1->SourceFileExtensions).
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish) goto LAB_003de392;
          _Var3 = std::operator==(psVar6,__rhs);
          __rhs = __rhs + 1;
        } while (!_Var3);
        this_00 = *ppcVar8;
        psVar6 = cmSourceFile::GetFullPath(this_00,(string *)0x0);
        ppcVar7 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmSourceFile_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmSourceFile_*>_>_>
                  ::operator[](local_80,psVar6);
        *ppcVar7 = this_00;
      }
      else {
        bVar2 = std::operator==(&local_70,"CXX");
        if (bVar2) goto LAB_003de345;
LAB_003de392:
        psVar6 = cmSourceFile::GetFullPath(*ppcVar8,(string *)0x0);
        std::
        _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
        ::_M_insert_unique<std::__cxx11::string_const&>(local_78,psVar6);
      }
      std::__cxx11::string::~string((string *)&local_70);
    }
    std::_Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>::~_Vector_base(&local_98);
  }
  return local_a0;
}

Assistant:

std::string cmExtraCodeLiteGenerator::CollectSourceFiles(
  const cmMakefile* makefile, const cmGeneratorTarget* gt,
  std::map<std::string, cmSourceFile*>& cFiles,
  std::set<std::string>& otherFiles)
{
  const std::vector<std::string>& srcExts =
    this->GlobalGenerator->GetCMakeInstance()->GetSourceExtensions();

  std::string projectType;
  switch (gt->GetType()) {
    case cmStateEnums::EXECUTABLE: {
      projectType = "Executable";
    } break;
    case cmStateEnums::STATIC_LIBRARY: {
      projectType = "Static Library";
    } break;
    case cmStateEnums::SHARED_LIBRARY: {
      projectType = "Dynamic Library";
    } break;
    case cmStateEnums::MODULE_LIBRARY: {
      projectType = "Dynamic Library";
    } break;
    default: // intended fallthrough
      break;
  }

  switch (gt->GetType()) {
    case cmStateEnums::EXECUTABLE:
    case cmStateEnums::STATIC_LIBRARY:
    case cmStateEnums::SHARED_LIBRARY:
    case cmStateEnums::MODULE_LIBRARY: {
      std::vector<cmSourceFile*> sources;
      gt->GetSourceFiles(sources,
                         makefile->GetSafeDefinition("CMAKE_BUILD_TYPE"));
      for (std::vector<cmSourceFile*>::const_iterator si = sources.begin();
           si != sources.end(); si++) {
        // check whether it is a C/C++ implementation file
        bool isCFile = false;
        std::string lang = (*si)->GetLanguage();
        if (lang == "C" || lang == "CXX") {
          std::string const& srcext = (*si)->GetExtension();
          for (std::vector<std::string>::const_iterator ext = srcExts.begin();
               ext != srcExts.end(); ++ext) {
            if (srcext == *ext) {
              isCFile = true;
              break;
            }
          }
        }

        // then put it accordingly into one of the two containers
        if (isCFile) {
          cFiles[(*si)->GetFullPath()] = *si;
        } else {
          otherFiles.insert((*si)->GetFullPath());
        }
      }
    }
    default: // intended fallthrough
      break;
  }
  return projectType;
}